

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

int tinyobj::pnpoly<float>(int nvert,float *vertx,float *verty,float testx,float testy)

{
  uint local_34;
  int local_30;
  int c;
  int j;
  int i;
  float testy_local;
  float testx_local;
  float *verty_local;
  float *vertx_local;
  int nvert_local;
  
  local_34 = 0;
  local_30 = nvert + -1;
  for (c = 0; c < nvert; c = c + 1) {
    if ((testy < verty[c] != testy < verty[local_30]) &&
       (testx < ((vertx[local_30] - vertx[c]) * (testy - verty[c])) / (verty[local_30] - verty[c]) +
                vertx[c])) {
      local_34 = (uint)((local_34 != 0 ^ 0xffU) & 1);
    }
    local_30 = c;
  }
  return local_34;
}

Assistant:

static int pnpoly(int nvert, T *vertx, T *verty, T testx, T testy) {
  int i, j, c = 0;
  for (i = 0, j = nvert - 1; i < nvert; j = i++) {
    if (((verty[i] > testy) != (verty[j] > testy)) &&
        (testx <
         (vertx[j] - vertx[i]) * (testy - verty[i]) / (verty[j] - verty[i]) +
             vertx[i]))
      c = !c;
  }
  return c;
}